

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenLiteral * BinaryenLiteralFloat32Bits(BinaryenLiteral *__return_storage_ptr__,int32_t x)

{
  Literal x_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc4 [12];
  Literal local_28;
  
  wasm::Literal::castToF32(&local_28,(Literal *)&stack0xffffffffffffffc0);
  x_00.field_0._8_4_ = x;
  x_00.field_0.i64 = in_stack_ffffffffffffffb8;
  x_00._12_12_ = in_stack_ffffffffffffffc4;
  toBinaryenLiteral(__return_storage_ptr__,x_00);
  wasm::Literal::~Literal(&local_28);
  wasm::Literal::~Literal((Literal *)&stack0xffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral BinaryenLiteralFloat32Bits(int32_t x) {
  return toBinaryenLiteral(Literal(x).castToF32());
}